

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COBLoader.cpp
# Opt level: O2

aiNode * __thiscall
Assimp::COBImporter::BuildNodes(COBImporter *this,Node *root,Scene *scin,aiScene *fill)

{
  float fVar1;
  ai_real aVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  Type TVar9;
  Shader SVar10;
  Face *pFVar11;
  pointer pVVar12;
  undefined8 uVar13;
  _Elt_pointer ppNVar14;
  undefined1 auVar15 [16];
  ai_real aVar16;
  ai_real aVar17;
  ai_real aVar18;
  ai_real aVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  uint uVar34;
  int iVar35;
  aiNode *this_00;
  _Elt_pointer ppFVar36;
  aiMesh *this_01;
  ulong uVar37;
  aiVector3D *paVar38;
  size_type sVar39;
  size_type *psVar40;
  aiFace *paVar41;
  long lVar42;
  uint *puVar43;
  long lVar44;
  Logger *this_02;
  Material *this_03;
  aiMaterial *this_04;
  ostream *this_05;
  _Rb_tree_node_base *p_Var45;
  aiLight *this_06;
  aiCamera *this_07;
  aiNode **__s;
  aiNode *paVar46;
  uint uVar47;
  _Map_pointer pppFVar48;
  aiFace *paVar49;
  pointer pVVar50;
  _Elt_pointer ppNVar51;
  Material *m;
  ulong uVar52;
  size_t sVar53;
  _Elt_pointer ppFVar54;
  _Elt_pointer ppNVar55;
  Light *ndlight;
  _Map_pointer pppNVar56;
  unique_ptr<const_Assimp::COB::Material,_std::default_delete<const_Assimp::COB::Material>_> defmat;
  _Map_pointer local_698;
  _Elt_pointer local_688;
  __shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2> local_658;
  __shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2> local_648;
  __shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2> local_638;
  pair<unsigned_int,_std::deque<Assimp::COB::Face_*,_std::allocator<Assimp::COB::Face_*>_>_>
  local_628;
  void *local_5d0;
  ulong local_5c8;
  int tmp;
  ai_real aStack_5ac;
  float local_5a8;
  aiString s;
  
  this_00 = (aiNode *)operator_new(0x478);
  aiNode::aiNode(this_00);
  uVar52 = (root->name)._M_string_length;
  if (uVar52 < 0x400) {
    (this_00->mName).length = (ai_uint32)uVar52;
    memcpy((this_00->mName).data,(root->name)._M_dataplus._M_p,uVar52);
    (this_00->mName).data[uVar52] = '\0';
  }
  fVar30 = (root->transform).a1;
  fVar31 = (root->transform).a2;
  fVar32 = (root->transform).a3;
  fVar33 = (root->transform).a4;
  fVar26 = (root->transform).b1;
  fVar27 = (root->transform).b2;
  fVar28 = (root->transform).b3;
  fVar29 = (root->transform).b4;
  fVar22 = (root->transform).c1;
  fVar23 = (root->transform).c2;
  fVar24 = (root->transform).c3;
  fVar25 = (root->transform).c4;
  fVar1 = (root->transform).d2;
  fVar20 = (root->transform).d3;
  fVar21 = (root->transform).d4;
  (this_00->mTransformation).d1 = (root->transform).d1;
  (this_00->mTransformation).d2 = fVar1;
  (this_00->mTransformation).d3 = fVar20;
  (this_00->mTransformation).d4 = fVar21;
  (this_00->mTransformation).c1 = fVar22;
  (this_00->mTransformation).c2 = fVar23;
  (this_00->mTransformation).c3 = fVar24;
  (this_00->mTransformation).c4 = fVar25;
  (this_00->mTransformation).b1 = fVar26;
  (this_00->mTransformation).b2 = fVar27;
  (this_00->mTransformation).b3 = fVar28;
  (this_00->mTransformation).b4 = fVar29;
  (this_00->mTransformation).a1 = fVar30;
  (this_00->mTransformation).a2 = fVar31;
  (this_00->mTransformation).a3 = fVar32;
  (this_00->mTransformation).a4 = fVar33;
  TVar9 = root->type;
  if (TVar9 == TYPE_CAMERA) {
    this_07 = (aiCamera *)operator_new(0x438);
    aiCamera::aiCamera(this_07);
    uVar34 = fill->mNumCameras;
    fill->mNumCameras = uVar34 + 1;
    fill->mCameras[uVar34] = this_07;
    uVar52 = (root->name)._M_string_length;
    if (uVar52 < 0x400) {
      (this_07->mName).length = (ai_uint32)uVar52;
      memcpy((this_07->mName).data,(root->name)._M_dataplus._M_p,uVar52);
      (this_07->mName).data[uVar52] = '\0';
    }
  }
  else if (TVar9 == TYPE_LIGHT) {
    this_06 = (aiLight *)operator_new(0x46c);
    aiLight::aiLight(this_06);
    uVar34 = fill->mNumLights;
    fill->mNumLights = uVar34 + 1;
    fill->mLights[uVar34] = this_06;
    uVar52 = (root->name)._M_string_length;
    if (uVar52 < 0x400) {
      (this_06->mName).length = (ai_uint32)uVar52;
      memcpy((this_06->mName).data,(root->name)._M_dataplus._M_p,uVar52);
      (this_06->mName).data[uVar52] = '\0';
    }
    aVar18 = *(ai_real *)&root[1]._vptr_Node;
    aVar19 = *(ai_real *)((long)&root[1]._vptr_Node + 4);
    aVar2 = *(ai_real *)&root->field_0xd4;
    aVar16 = *(ai_real *)&root->field_0xd4;
    aVar17 = *(ai_real *)&root[1]._vptr_Node;
    (this_06->mColorSpecular).g = aVar18;
    (this_06->mColorSpecular).b = aVar19;
    (this_06->mColorAmbient).r = aVar2;
    (this_06->mColorAmbient).g = aVar18;
    (this_06->mColorAmbient).b = aVar19;
    (this_06->mColorDiffuse).r = aVar16;
    (this_06->mColorDiffuse).g = aVar17;
    (this_06->mColorDiffuse).b = aVar19;
    (this_06->mColorSpecular).r = aVar2;
    uVar5 = root[1].super_ChunkInfo.id;
    uVar8 = root[1].super_ChunkInfo.parent_id;
    this_06->mAngleInnerCone = (float)uVar8 * 0.017453292;
    this_06->mAngleOuterCone = (float)uVar5 * 0.017453292;
    this_06->mType = (uint)(root[1].super_ChunkInfo.version == 0) * 2 + aiLightSource_DIRECTIONAL;
  }
  else if (((TVar9 == TYPE_MESH) &&
           (root[1].temp_children.
            super__Deque_base<const_Assimp::COB::Node_*,_std::allocator<const_Assimp::COB::Node_*>_>
            ._M_impl.super__Deque_impl_data._M_map != *(_Map_pointer *)&root[1].type)) &&
          (*(_func_int ***)&root[1].super_ChunkInfo != root[1]._vptr_Node)) {
    for (p_Var45 = (_Rb_tree_node_base *)
                   root[1].temp_children.
                   super__Deque_base<const_Assimp::COB::Node_*,_std::allocator<const_Assimp::COB::Node_*>_>
                   ._M_impl.super__Deque_impl_data._M_finish._M_node;
        p_Var45 !=
        (_Rb_tree_node_base *)
        &root[1].temp_children.
         super__Deque_base<const_Assimp::COB::Node_*,_std::allocator<const_Assimp::COB::Node_*>_>.
         _M_impl.super__Deque_impl_data._M_finish._M_first;
        p_Var45 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var45)) {
      std::
      pair<unsigned_int,_std::deque<Assimp::COB::Face_*,_std::allocator<Assimp::COB::Face_*>_>_>::
      pair<const_unsigned_int,_std::deque<Assimp::COB::Face_*,_std::allocator<Assimp::COB::Face_*>_>,_true>
                (&local_628,
                 (pair<const_unsigned_int,_std::deque<Assimp::COB::Face_*,_std::allocator<Assimp::COB::Face_*>_>_>
                  *)(p_Var45 + 1));
      uVar52 = 0;
      ppFVar36 = local_628.second.
                 super__Deque_base<Assimp::COB::Face_*,_std::allocator<Assimp::COB::Face_*>_>.
                 _M_impl.super__Deque_impl_data._M_start._M_cur;
      pppFVar48 = local_628.second.
                  super__Deque_base<Assimp::COB::Face_*,_std::allocator<Assimp::COB::Face_*>_>.
                  _M_impl.super__Deque_impl_data._M_start._M_node;
      ppFVar54 = local_628.second.
                 super__Deque_base<Assimp::COB::Face_*,_std::allocator<Assimp::COB::Face_*>_>.
                 _M_impl.super__Deque_impl_data._M_start._M_last;
      while (ppFVar36 !=
             local_628.second.
             super__Deque_base<Assimp::COB::Face_*,_std::allocator<Assimp::COB::Face_*>_>._M_impl.
             super__Deque_impl_data._M_finish._M_cur) {
        uVar52 = uVar52 + ((long)((*ppFVar36)->indices).
                                 super__Vector_base<Assimp::COB::VertexIndex,_std::allocator<Assimp::COB::VertexIndex>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)((*ppFVar36)->indices).
                                 super__Vector_base<Assimp::COB::VertexIndex,_std::allocator<Assimp::COB::VertexIndex>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 3);
        ppFVar36 = ppFVar36 + 1;
        if (ppFVar36 == ppFVar54) {
          ppFVar36 = pppFVar48[1];
          pppFVar48 = pppFVar48 + 1;
          ppFVar54 = ppFVar36 + 0x40;
        }
      }
      if (uVar52 != 0) {
        this_01 = (aiMesh *)operator_new(0x520);
        aiMesh::aiMesh(this_01);
        uVar34 = fill->mNumMeshes;
        fill->mNumMeshes = uVar34 + 1;
        fill->mMeshes[uVar34] = this_01;
        this_00->mNumMeshes = this_00->mNumMeshes + 1;
        auVar15._8_8_ = 0;
        auVar15._0_8_ = uVar52;
        uVar37 = SUB168(auVar15 * ZEXT816(0xc),0);
        uVar52 = uVar37;
        if (SUB168(auVar15 * ZEXT816(0xc),8) != 0) {
          uVar52 = 0xffffffffffffffff;
        }
        paVar38 = (aiVector3D *)operator_new__(uVar52);
        uVar37 = uVar37 - 0xc;
        sVar53 = (uVar37 - uVar37 % 0xc) + 0xc;
        memset(paVar38,0,sVar53);
        this_01->mVertices = paVar38;
        paVar38 = (aiVector3D *)operator_new__(uVar52);
        memset(paVar38,0,sVar53);
        this_01->mTextureCoords[0] = paVar38;
        sVar39 = std::deque<Assimp::COB::Face_*,_std::allocator<Assimp::COB::Face_*>_>::size
                           (&local_628.second);
        psVar40 = (size_type *)operator_new__(-(ulong)(sVar39 >> 0x3c != 0) | sVar39 * 0x10 | 8);
        ppFVar54 = local_628.second.
                   super__Deque_base<Assimp::COB::Face_*,_std::allocator<Assimp::COB::Face_*>_>.
                   _M_impl.super__Deque_impl_data._M_finish._M_cur;
        *psVar40 = sVar39;
        paVar41 = (aiFace *)(psVar40 + 1);
        if (sVar39 != 0) {
          paVar49 = paVar41;
          do {
            paVar49->mNumIndices = 0;
            paVar49->mIndices = (uint *)0x0;
            paVar49 = paVar49 + 1;
          } while (paVar49 != paVar41 + sVar39);
        }
        this_01->mFaces = paVar41;
        local_688 = local_628.second.
                    super__Deque_base<Assimp::COB::Face_*,_std::allocator<Assimp::COB::Face_*>_>.
                    _M_impl.super__Deque_impl_data._M_start._M_last;
        local_698 = local_628.second.
                    super__Deque_base<Assimp::COB::Face_*,_std::allocator<Assimp::COB::Face_*>_>.
                    _M_impl.super__Deque_impl_data._M_start._M_node;
        ppFVar36 = local_628.second.
                   super__Deque_base<Assimp::COB::Face_*,_std::allocator<Assimp::COB::Face_*>_>.
                   _M_impl.super__Deque_impl_data._M_start._M_cur;
        while (ppFVar36 != ppFVar54) {
          pFVar11 = *ppFVar36;
          if ((pFVar11->indices).
              super__Vector_base<Assimp::COB::VertexIndex,_std::allocator<Assimp::COB::VertexIndex>_>
              ._M_impl.super__Vector_impl_data._M_start !=
              (pFVar11->indices).
              super__Vector_base<Assimp::COB::VertexIndex,_std::allocator<Assimp::COB::VertexIndex>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            uVar34 = this_01->mNumFaces;
            this_01->mNumFaces = uVar34 + 1;
            paVar41 = this_01->mFaces + uVar34;
            lVar42 = (long)(pFVar11->indices).
                           super__Vector_base<Assimp::COB::VertexIndex,_std::allocator<Assimp::COB::VertexIndex>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(pFVar11->indices).
                           super__Vector_base<Assimp::COB::VertexIndex,_std::allocator<Assimp::COB::VertexIndex>_>
                           ._M_impl.super__Vector_impl_data._M_start;
            uVar52 = lVar42 >> 1;
            if (lVar42 < 0) {
              uVar52 = 0xffffffffffffffff;
            }
            puVar43 = (uint *)operator_new__(uVar52);
            paVar41->mIndices = puVar43;
            pVVar12 = (pFVar11->indices).
                      super__Vector_base<Assimp::COB::VertexIndex,_std::allocator<Assimp::COB::VertexIndex>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            for (pVVar50 = (pFVar11->indices).
                           super__Vector_base<Assimp::COB::VertexIndex,_std::allocator<Assimp::COB::VertexIndex>_>
                           ._M_impl.super__Vector_impl_data._M_start; pVVar50 != pVVar12;
                pVVar50 = pVVar50 + 1) {
              lVar42 = *(long *)&root[1].type;
              if ((ulong)(((long)root[1].temp_children.
                                 super__Deque_base<const_Assimp::COB::Node_*,_std::allocator<const_Assimp::COB::Node_*>_>
                                 ._M_impl.super__Deque_impl_data._M_map - lVar42) / 0xc) <=
                  (ulong)pVVar50->pos_idx) {
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&s,"Position index out of range",(allocator<char> *)&tmp);
                ThrowException((string *)&s);
              }
              if ((ulong)(*(long *)&root[1].super_ChunkInfo - (long)root[1]._vptr_Node >> 3) <=
                  (ulong)pVVar50->uv_idx) {
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&s,"UV index out of range",(allocator<char> *)&tmp);
                ThrowException((string *)&s);
              }
              lVar44 = (ulong)pVVar50->pos_idx * 0xc;
              paVar38 = this_01->mVertices;
              uVar34 = this_01->mNumVertices;
              paVar38[uVar34].z = *(float *)(lVar42 + 8 + lVar44);
              uVar13 = *(undefined8 *)(lVar42 + lVar44);
              paVar38 = paVar38 + uVar34;
              paVar38->x = (float)(int)uVar13;
              paVar38->y = (float)(int)((ulong)uVar13 >> 0x20);
              paVar38 = this_01->mTextureCoords[0];
              uVar34 = this_01->mNumVertices;
              *(_func_int **)(paVar38 + uVar34) = root[1]._vptr_Node[pVVar50->uv_idx];
              paVar38[uVar34].z = 0.0;
              uVar34 = this_01->mNumVertices;
              this_01->mNumVertices = uVar34 + 1;
              uVar47 = paVar41->mNumIndices;
              paVar41->mNumIndices = uVar47 + 1;
              paVar41->mIndices[uVar47] = uVar34;
            }
          }
          ppFVar36 = ppFVar36 + 1;
          if (ppFVar36 == local_688) {
            ppFVar36 = local_698[1];
            local_698 = local_698 + 1;
            local_688 = ppFVar36 + 0x40;
          }
        }
        this_01->mMaterialIndex = fill->mNumMaterials;
        for (this_03 = (scin->materials).
                       super__Vector_base<Assimp::COB::Material,_std::allocator<Assimp::COB::Material>_>
                       ._M_impl.super__Vector_impl_data._M_start;
            this_03 !=
            (scin->materials).
            super__Vector_base<Assimp::COB::Material,_std::allocator<Assimp::COB::Material>_>.
            _M_impl.super__Vector_impl_data._M_finish; this_03 = this_03 + 1) {
          if (((this_03->super_ChunkInfo).parent_id == (root->super_ChunkInfo).id) &&
             (this_03->matnum == local_628.first)) {
            defmat._M_t.
            super___uniq_ptr_impl<const_Assimp::COB::Material,_std::default_delete<const_Assimp::COB::Material>_>
            ._M_t.
            super__Tuple_impl<0UL,_const_Assimp::COB::Material_*,_std::default_delete<const_Assimp::COB::Material>_>
            .super__Head_base<0UL,_const_Assimp::COB::Material_*,_false>._M_head_impl =
                 (__uniq_ptr_data<const_Assimp::COB::Material,_std::default_delete<const_Assimp::COB::Material>,_true,_true>
                  )(__uniq_ptr_impl<const_Assimp::COB::Material,_std::default_delete<const_Assimp::COB::Material>_>
                    )0x0;
            goto LAB_0047442c;
          }
        }
        defmat._M_t.
        super___uniq_ptr_impl<const_Assimp::COB::Material,_std::default_delete<const_Assimp::COB::Material>_>
        ._M_t.
        super__Tuple_impl<0UL,_const_Assimp::COB::Material_*,_std::default_delete<const_Assimp::COB::Material>_>
        .super__Head_base<0UL,_const_Assimp::COB::Material_*,_false>._M_head_impl =
             (__uniq_ptr_data<const_Assimp::COB::Material,_std::default_delete<const_Assimp::COB::Material>,_true,_true>
              )(__uniq_ptr_impl<const_Assimp::COB::Material,_std::default_delete<const_Assimp::COB::Material>_>
                )0x0;
        this_02 = DefaultLogger::get();
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&s);
        std::operator<<((ostream *)&s,"Could not resolve material index ");
        std::ostream::_M_insert<unsigned_long>((ulong)&s);
        std::operator<<((ostream *)&s," - creating default material for this slot");
        std::__cxx11::stringbuf::str();
        Logger::debug(this_02,_tmp);
        std::__cxx11::string::~string((string *)&tmp);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&s);
        this_03 = (Material *)operator_new(0x90);
        COB::Material::Material(this_03);
        std::
        __uniq_ptr_impl<const_Assimp::COB::Material,_std::default_delete<const_Assimp::COB::Material>_>
        ::reset((__uniq_ptr_impl<const_Assimp::COB::Material,_std::default_delete<const_Assimp::COB::Material>_>
                 *)&defmat,this_03);
LAB_0047442c:
        this_04 = (aiMaterial *)operator_new(0x10);
        aiMaterial::aiMaterial(this_04);
        uVar34 = fill->mNumMaterials;
        fill->mNumMaterials = uVar34 + 1;
        fill->mMaterials[uVar34] = this_04;
        Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
        basic_formatter<char[6]>
                  ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)&tmp,
                   (char (*) [6])"#mat_");
        this_05 = (ostream *)
                  Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                  operator<<((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                             &tmp,&fill->mNumMeshes);
        std::operator<<(this_05,"_");
        Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator<<
                  ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)this_05,
                   &this_03->matnum);
        std::__cxx11::stringbuf::str();
        sVar53 = local_5c8 & 0xffffffff;
        if ((local_5c8 & 0xfffffc00) != 0) {
          sVar53 = 0x3ff;
        }
        s.length = (ai_uint32)sVar53;
        memcpy(s.data,local_5d0,sVar53);
        s.data[sVar53] = '\0';
        std::__cxx11::string::~string((string *)&local_5d0);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&tmp);
        aiMaterial::AddProperty(this_04,&s,"?mat.name",0,0);
        uVar34 = *(uint *)&root[1].temp_children.
                           super__Deque_base<const_Assimp::COB::Node_*,_std::allocator<const_Assimp::COB::Node_*>_>
                           ._M_impl.super__Deque_impl_data._M_start._M_node & 4;
        uVar47 = uVar34 >> 2;
        tmp = uVar47;
        if (uVar34 != 0) {
          aiMaterial::AddProperty(this_04,&tmp,1,"$mat.wireframe",0,0);
        }
        SVar10 = this_03->shader;
        if (SVar10 == METAL) {
          tmp = 8;
        }
        else if (SVar10 == PHONG) {
          tmp = 3;
        }
        else {
          if (SVar10 != FLAT) {
            __assert_fail("false",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/COB/COBLoader.cpp"
                          ,0x152,
                          "aiNode *Assimp::COBImporter::BuildNodes(const Node &, const Scene &, aiScene *)"
                         );
          }
          tmp = 2;
        }
        aiMaterial::AddProperty(this_04,&tmp,1,"$mat.shadingm",0,0);
        if (tmp != 2) {
          aiMaterial::AddProperty(this_04,&this_03->exp,1,"$mat.shininess",0,0);
        }
        aiMaterial::AddProperty(this_04,&this_03->ior,1,"$mat.refracti",0,0);
        aiMaterial::AddProperty(this_04,&this_03->rgb,1,"$clr.diffuse",0,0);
        fVar1 = this_03->ks;
        local_5a8 = (this_03->rgb).b * fVar1;
        uVar3 = (this_03->rgb).r;
        uVar6 = (this_03->rgb).g;
        aStack_5ac = fVar1 * (float)uVar6;
        tmp = (int)(fVar1 * (float)uVar3);
        aiMaterial::AddProperty(this_04,(aiColor3D *)&tmp,1,"$clr.specular",0,0);
        fVar1 = this_03->ka;
        local_5a8 = (this_03->rgb).b * fVar1;
        uVar4 = (this_03->rgb).r;
        uVar7 = (this_03->rgb).g;
        _tmp = (char *)CONCAT44(fVar1 * (float)uVar7,fVar1 * (float)uVar4);
        aiMaterial::AddProperty(this_04,(aiColor3D *)&tmp,1,"$clr.ambient",0,0);
        if ((this_03->tex_color).
            super___shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            (element_type *)0x0) {
          std::__shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    (&local_638,
                     &(this_03->tex_color).
                      super___shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>);
          ConvertTexture((shared_ptr<Assimp::COB::Texture> *)&local_638,this_04,
                         aiTextureType_DIFFUSE);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_638._M_refcount);
        }
        if ((this_03->tex_env).super___shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr != (element_type *)0x0) {
          std::__shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    (&local_648,
                     &(this_03->tex_env).
                      super___shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>);
          ConvertTexture((shared_ptr<Assimp::COB::Texture> *)&local_648,this_04,
                         aiTextureType_UNKNOWN);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_648._M_refcount);
        }
        if ((this_03->tex_bump).super___shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr != (element_type *)0x0) {
          std::__shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    (&local_658,
                     &(this_03->tex_bump).
                      super___shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>);
          ConvertTexture((shared_ptr<Assimp::COB::Texture> *)&local_658,this_04,aiTextureType_HEIGHT
                        );
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_658._M_refcount);
        }
        std::
        unique_ptr<const_Assimp::COB::Material,_std::default_delete<const_Assimp::COB::Material>_>::
        ~unique_ptr(&defmat);
      }
      std::_Deque_base<Assimp::COB::Face_*,_std::allocator<Assimp::COB::Face_*>_>::~_Deque_base
                (&local_628.second.
                  super__Deque_base<Assimp::COB::Face_*,_std::allocator<Assimp::COB::Face_*>_>);
    }
  }
  uVar52 = (ulong)this_00->mNumMeshes;
  if (uVar52 != 0) {
    puVar43 = (uint *)operator_new__(uVar52 << 2);
    this_00->mMeshes = puVar43;
    iVar35 = -1;
    for (uVar37 = 0; uVar37 < uVar52; uVar37 = uVar37 + 1) {
      this_00->mMeshes[uVar37] = fill->mNumMeshes + iVar35;
      uVar52 = (ulong)this_00->mNumMeshes;
      iVar35 = iVar35 + -1;
    }
  }
  sVar39 = std::deque<const_Assimp::COB::Node_*,_std::allocator<const_Assimp::COB::Node_*>_>::size
                     (&root->temp_children);
  uVar52 = -(ulong)(sVar39 >> 0x3d != 0) | sVar39 * 8;
  __s = (aiNode **)operator_new__(uVar52);
  memset(__s,0,uVar52);
  this_00->mChildren = __s;
  ppNVar51 = (root->temp_children).
             super__Deque_base<const_Assimp::COB::Node_*,_std::allocator<const_Assimp::COB::Node_*>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur;
  ppNVar55 = (root->temp_children).
             super__Deque_base<const_Assimp::COB::Node_*,_std::allocator<const_Assimp::COB::Node_*>_>
             ._M_impl.super__Deque_impl_data._M_start._M_last;
  pppNVar56 = (root->temp_children).
              super__Deque_base<const_Assimp::COB::Node_*,_std::allocator<const_Assimp::COB::Node_*>_>
              ._M_impl.super__Deque_impl_data._M_start._M_node;
  ppNVar14 = (root->temp_children).
             super__Deque_base<const_Assimp::COB::Node_*,_std::allocator<const_Assimp::COB::Node_*>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  while (ppNVar51 != ppNVar14) {
    paVar46 = BuildNodes(this,*ppNVar51,scin,fill);
    uVar34 = this_00->mNumChildren;
    this_00->mNumChildren = uVar34 + 1;
    this_00->mChildren[uVar34] = paVar46;
    paVar46->mParent = this_00;
    ppNVar51 = ppNVar51 + 1;
    if (ppNVar51 == ppNVar55) {
      ppNVar51 = pppNVar56[1];
      pppNVar56 = pppNVar56 + 1;
      ppNVar55 = ppNVar51 + 0x40;
    }
  }
  return this_00;
}

Assistant:

aiNode* COBImporter::BuildNodes(const Node& root,const Scene& scin,aiScene* fill)
{
    aiNode* nd = new aiNode();
    nd->mName.Set(root.name);
    nd->mTransformation = root.transform;

    // Note to everybody believing Voodoo is appropriate here:
    // I know polymorphism, run as fast as you can ;-)
    if (Node::TYPE_MESH == root.type) {
        const Mesh& ndmesh = (const Mesh&)(root);
        if (ndmesh.vertex_positions.size() && ndmesh.texture_coords.size()) {

            typedef std::pair<unsigned int,Mesh::FaceRefList> Entry;
            for(const Entry& reflist : ndmesh.temp_map) {
                {   // create mesh
                    size_t n = 0;
                    for(Face* f : reflist.second) {
                        n += f->indices.size();
                    }
                    if (!n) {
                        continue;
                    }
                    aiMesh* outmesh = fill->mMeshes[fill->mNumMeshes++] = new aiMesh();
                    ++nd->mNumMeshes;

                    outmesh->mVertices = new aiVector3D[n];
                    outmesh->mTextureCoords[0] = new aiVector3D[n];

                    outmesh->mFaces = new aiFace[reflist.second.size()]();
                    for(Face* f : reflist.second) {
                        if (f->indices.empty()) {
                            continue;
                        }

                        aiFace& fout = outmesh->mFaces[outmesh->mNumFaces++];
                        fout.mIndices = new unsigned int[f->indices.size()];

                        for(VertexIndex& v : f->indices) {
                            if (v.pos_idx >= ndmesh.vertex_positions.size()) {
                                ThrowException("Position index out of range");
                            }
                            if (v.uv_idx >= ndmesh.texture_coords.size()) {
                                ThrowException("UV index out of range");
                            }
                            outmesh->mVertices[outmesh->mNumVertices] = ndmesh.vertex_positions[ v.pos_idx ];
                            outmesh->mTextureCoords[0][outmesh->mNumVertices] = aiVector3D(
                                ndmesh.texture_coords[ v.uv_idx ].x,
                                ndmesh.texture_coords[ v.uv_idx ].y,
                                0.f
                            );

                            fout.mIndices[fout.mNumIndices++] = outmesh->mNumVertices++;
                        }
                    }
                    outmesh->mMaterialIndex = fill->mNumMaterials;
                }{  // create material
                    const Material* min = NULL;
                    for(const Material& m : scin.materials) {
                        if (m.parent_id == ndmesh.id && m.matnum == reflist.first) {
                            min = &m;
                            break;
                        }
                    }
                    std::unique_ptr<const Material> defmat;
                    if(!min) {
                        ASSIMP_LOG_DEBUG(format()<<"Could not resolve material index "
                            <<reflist.first<<" - creating default material for this slot");

                        defmat.reset(min=new Material());
                    }

                    aiMaterial* mat = new aiMaterial();
                    fill->mMaterials[fill->mNumMaterials++] = mat;

                    const aiString s(format("#mat_")<<fill->mNumMeshes<<"_"<<min->matnum);
                    mat->AddProperty(&s,AI_MATKEY_NAME);

                    if(int tmp = ndmesh.draw_flags & Mesh::WIRED ? 1 : 0) {
                        mat->AddProperty(&tmp,1,AI_MATKEY_ENABLE_WIREFRAME);
                    }

                    {   int shader;
                        switch(min->shader)
                        {
                        case Material::FLAT:
                            shader = aiShadingMode_Gouraud;
                            break;

                        case Material::PHONG:
                            shader = aiShadingMode_Phong;
                            break;

                        case Material::METAL:
                            shader = aiShadingMode_CookTorrance;
                            break;

                        default:
                            ai_assert(false); // shouldn't be here
                        }
                        mat->AddProperty(&shader,1,AI_MATKEY_SHADING_MODEL);
                        if(shader != aiShadingMode_Gouraud) {
                            mat->AddProperty(&min->exp,1,AI_MATKEY_SHININESS);
                        }
                    }

                    mat->AddProperty(&min->ior,1,AI_MATKEY_REFRACTI);
                    mat->AddProperty(&min->rgb,1,AI_MATKEY_COLOR_DIFFUSE);

                    aiColor3D c = aiColor3D(min->rgb)*min->ks;
                    mat->AddProperty(&c,1,AI_MATKEY_COLOR_SPECULAR);

                    c = aiColor3D(min->rgb)*min->ka;
                    mat->AddProperty(&c,1,AI_MATKEY_COLOR_AMBIENT);

                    // convert textures if some exist.
                    if(min->tex_color) {
                        ConvertTexture(min->tex_color,mat,aiTextureType_DIFFUSE);
                    }
                    if(min->tex_env) {
                        ConvertTexture(min->tex_env  ,mat,aiTextureType_UNKNOWN);
                    }
                    if(min->tex_bump) {
                        ConvertTexture(min->tex_bump ,mat,aiTextureType_HEIGHT);
                    }
                }
            }
        }
    }
    else if (Node::TYPE_LIGHT == root.type) {
        const Light& ndlight = (const Light&)(root);
        aiLight* outlight = fill->mLights[fill->mNumLights++] = new aiLight();

        outlight->mName.Set(ndlight.name);
        outlight->mColorDiffuse = outlight->mColorAmbient = outlight->mColorSpecular = ndlight.color;

        outlight->mAngleOuterCone = AI_DEG_TO_RAD(ndlight.angle);
        outlight->mAngleInnerCone = AI_DEG_TO_RAD(ndlight.inner_angle);

        // XXX
        outlight->mType = ndlight.ltype==Light::SPOT ? aiLightSource_SPOT : aiLightSource_DIRECTIONAL;
    }
    else if (Node::TYPE_CAMERA == root.type) {
        const Camera& ndcam = (const Camera&)(root);
        aiCamera* outcam = fill->mCameras[fill->mNumCameras++] = new aiCamera();

        outcam->mName.Set(ndcam.name);
    }

    // add meshes
    if (nd->mNumMeshes) { // mMeshes must be NULL if count is 0
        nd->mMeshes = new unsigned int[nd->mNumMeshes];
        for(unsigned int i = 0; i < nd->mNumMeshes;++i) {
            nd->mMeshes[i] = fill->mNumMeshes-i-1;
        }
    }

    // add children recursively
    nd->mChildren = new aiNode*[root.temp_children.size()]();
    for(const Node* n : root.temp_children) {
        (nd->mChildren[nd->mNumChildren++] = BuildNodes(*n,scin,fill))->mParent = nd;
    }

    return nd;
}